

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O3

bool __thiscall Json::JsonArray::put(JsonArray *this,shared_ptr<Json::JsonValue> *jsonValue)

{
  element_type *peVar1;
  pointer psVar2;
  bool bVar3;
  pointer psVar4;
  long lVar5;
  
  peVar1 = (jsonValue->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_00106e99:
    bVar3 = false;
  }
  else {
    psVar4 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)psVar2 - (long)psVar4;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 4;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      do {
        if ((psVar4->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            peVar1) {
          if (psVar4 != psVar2) goto LAB_00106e99;
          break;
        }
        psVar4 = psVar4 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    (*peVar1->_vptr_JsonValue[6])(peVar1,(ulong)(byte)(this->super_JsonFormatter).field_0x26);
    std::
    vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>::
    push_back(&this->__lstJsonArray,jsonValue);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Json::JsonArray::put(const std::shared_ptr<JsonValue> &jsonValue) {
    if (jsonValue == nullptr)return false;
    if (find(jsonValue.get()) != __lstJsonArray.end())return false;
    jsonValue->setEscapeChar(__escape);
    __lstJsonArray.push_back(jsonValue);
    return true;
}